

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask23_32(uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  long unaff_RBX;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  
  uVar1 = in[1];
  vpmovsxbd_avx(ZEXT416(0x38281c0c));
  vpmovsxbd_avx512f(_DAT_001adcc0);
  auVar15 = vpmovsxbd_avx(ZEXT416(0x502));
  auVar10 = vpmovsxbd_avx512f(_DAT_001adcd0);
  uVar2 = in[0x19];
  *out = uVar1 << 0x17 | *in;
  auVar7 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)in[0x18]));
  auVar4 = vpsllvd_avx2(auVar7,_DAT_001a04a0);
  auVar11 = vpgatherdd_avx512f(*(undefined4 *)((long)in + unaff_RBX));
  auVar3 = vpmovsxbd_avx(ZEXT416(0x8050300));
  auVar7 = vpinsrd_avx(ZEXT416(in[0x11]),in[0x15],1);
  uVar6 = in[0x18] << 8;
  auVar9 = vextracti64x4_avx512f(auVar11,1);
  auVar9 = vpermd_avx2(ZEXT1632(auVar15),auVar9);
  auVar12 = valignd_avx512f(auVar11,auVar11,0xf);
  auVar13 = vpermd_avx512f(ZEXT1664(auVar3),auVar11);
  auVar3 = vpsrlvd_avx2(auVar13._0_16_,_DAT_001ad560);
  auVar15 = vpinsrd_avx(auVar12._0_16_,uVar1,0);
  auVar7._8_8_ = auVar7._0_8_;
  auVar7 = vpsllvd_avx2(auVar7,_DAT_001adca0);
  auVar12 = vinserti32x4_avx512f(auVar12,auVar15,0);
  auVar13 = vpermt2d_avx512f(ZEXT1664(auVar4),auVar10,ZEXT1664(auVar7));
  auVar15._8_8_ = auVar9._0_8_;
  auVar15._0_8_ = auVar9._0_8_;
  auVar7 = vpsrlvd_avx2(auVar15,_DAT_001adcb0);
  auVar14 = vpsllvd_avx512f(auVar11,_DAT_001b1380);
  auVar10 = vpermt2d_avx512f(ZEXT1664(auVar3),auVar10,ZEXT1664(auVar7));
  auVar12 = vpsrlvd_avx512f(auVar12,_DAT_001b1340);
  auVar10 = vpord_avx512f(auVar13,auVar10);
  auVar13._4_4_ = auVar10._4_4_;
  auVar13._0_4_ = auVar12._0_4_;
  auVar13._8_4_ = auVar12._8_4_;
  auVar13._12_4_ = auVar12._12_4_;
  auVar13._16_4_ = auVar10._16_4_;
  auVar13._20_4_ = auVar12._20_4_;
  auVar13._24_4_ = auVar10._24_4_;
  auVar13._28_4_ = auVar12._28_4_;
  auVar13._32_4_ = auVar12._32_4_;
  auVar13._36_4_ = auVar10._36_4_;
  auVar13._40_4_ = auVar12._40_4_;
  auVar13._44_4_ = auVar10._44_4_;
  auVar13._48_4_ = auVar12._48_4_;
  auVar13._52_4_ = auVar12._52_4_;
  auVar13._56_4_ = auVar10._56_4_;
  auVar13._60_4_ = auVar12._60_4_;
  auVar4 = vpmovsxbd_avx(ZEXT416(0x5000a01));
  auVar10 = vpord_avx512f(auVar14,auVar13);
  auVar10 = vmovdqu64_avx512f(auVar10);
  *(undefined1 (*) [64])(out + 1) = auVar10;
  auVar7 = vextracti32x4_avx512f(auVar11,3);
  vpmovsxbd_avx(ZEXT416(0x78746c68));
  uVar1 = in[0x1c];
  out[0x11] = uVar2 << 0x1f | uVar6 | auVar7._12_4_ >> 0xf;
  auVar8 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar6));
  auVar7 = vpshufd_avx(auVar8,0xa0);
  auVar7 = vpinsrd_avx(auVar7,uVar2,0);
  auVar15 = vpinsrd_avx(auVar7,uVar1 << 4,2);
  auVar3 = vpinsrd_avx(auVar4,auVar8._4_4_ >> 0x13,2);
  auVar5 = vpsrlvd_avx2(auVar7,auVar4);
  auVar4 = vpsllvd_avx2(auVar8,_DAT_001a5170);
  uVar1 = in[0x1f];
  auVar7 = vpor_avx(auVar15,auVar3);
  auVar7 = vpblendd_avx2(auVar5,auVar7,4);
  auVar7 = vpor_avx(auVar4,auVar7);
  *(undefined1 (*) [16])(out + 0x12) = auVar7;
  out[0x16] = uVar1 << 9 | auVar8._12_4_ >> 0xe;
  return out + 0x17;
}

Assistant:

uint32_t *__fastpackwithoutmask23_32(const uint32_t *__restrict__ in,
                                     uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 23;
  ++out;
  *out = ((*in)) >> (23 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (23 - 5);
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (23 - 19);
  ++in;
  *out |= ((*in)) << 19;
  ++out;
  *out = ((*in)) >> (23 - 10);
  ++in;
  *out |= ((*in)) << 10;
  ++out;
  *out = ((*in)) >> (23 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (23 - 15);
  ++in;
  *out |= ((*in)) << 15;
  ++out;
  *out = ((*in)) >> (23 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 29;
  ++out;
  *out = ((*in)) >> (23 - 20);
  ++in;
  *out |= ((*in)) << 20;
  ++out;
  *out = ((*in)) >> (23 - 11);
  ++in;
  *out |= ((*in)) << 11;
  ++out;
  *out = ((*in)) >> (23 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 25;
  ++out;
  *out = ((*in)) >> (23 - 16);
  ++in;
  *out |= ((*in)) << 16;
  ++out;
  *out = ((*in)) >> (23 - 7);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (23 - 21);
  ++in;
  *out |= ((*in)) << 21;
  ++out;
  *out = ((*in)) >> (23 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (23 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (23 - 17);
  ++in;
  *out |= ((*in)) << 17;
  ++out;
  *out = ((*in)) >> (23 - 8);
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (23 - 22);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (23 - 13);
  ++in;
  *out |= ((*in)) << 13;
  ++out;
  *out = ((*in)) >> (23 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (23 - 18);
  ++in;
  *out |= ((*in)) << 18;
  ++out;
  *out = ((*in)) >> (23 - 9);
  ++in;
  *out |= ((*in)) << 9;
  ++out;
  ++in;

  return out;
}